

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverRemap(Mvc_Cover_t *p,int *pVarsRem,int nVarsRem)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar6;
  Mvc_Cube_t *pMVar7;
  byte bVar8;
  Mvc_Cube_t *pMVar9;
  ulong uVar10;
  ulong uVar11;
  Mvc_List_t *pList;
  
  pCover = Mvc_CoverAlloc(p->pMem,nVarsRem);
  pMVar9 = (p->lCubes).pHead;
  if (pMVar9 != (Mvc_Cube_t *)0x0) {
    do {
      pMVar6 = Mvc_CubeAlloc(pCover);
      uVar2 = *(uint *)&pMVar6->field_0x8;
      uVar3 = uVar2 & 0xffffff;
      bVar8 = (byte)(uVar2 >> 0x18);
      if ((ulong)uVar3 == 1) {
        pMVar6->pData[0] = 0xffffffff;
        *(uint *)&pMVar6->field_0x14 = 0xffffffff >> (bVar8 & 0x1f);
      }
      else if (uVar3 == 0) {
        pMVar6->pData[0] = 0xffffffff >> (bVar8 & 0x1f);
      }
      else {
        pMVar6->pData[uVar3] = 0xffffffff >> (bVar8 & 0x1f);
        memset(pMVar6->pData,0xff,(ulong)((uVar2 & 0xffffff) << 2));
      }
      pMVar7 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar7 = (pCover->lCubes).pTail;
      }
      pMVar7->pNext = pMVar6;
      (pCover->lCubes).pTail = pMVar6;
      pMVar6->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      pMVar9 = pMVar9->pNext;
    } while (pMVar9 != (Mvc_Cube_t *)0x0);
  }
  if (0 < nVarsRem) {
    uVar11 = 0;
    do {
      uVar2 = pVarsRem[uVar11];
      if (-1 < (int)uVar2) {
        if (p->nBits <= (int)uVar2) {
          __assert_fail("pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                        ,0x1a4,"Mvc_Cover_t *Mvc_CoverRemap(Mvc_Cover_t *, int *, int)");
        }
        iVar4 = Mvc_CoverReadCubeNum(p);
        iVar5 = Mvc_CoverReadCubeNum(pCover);
        if (iVar4 != iVar5) {
          __assert_fail("Mvc_CoverReadCubeNum(pCoverOld) == Mvc_CoverReadCubeNum(pCoverNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                        ,0x1be,"void Mvc_CoverCopyColumn(Mvc_Cover_t *, Mvc_Cover_t *, int, int)");
        }
        pMVar6 = Mvc_CoverReadCubeHead(pCover);
        pMVar9 = (p->lCubes).pHead;
        if (pMVar9 != (Mvc_Cube_t *)0x0) {
          uVar10 = uVar11 >> 5 & 0x7ffffff;
          bVar8 = (byte)uVar11 & 0x1f;
          do {
            uVar3 = pMVar6->pData[uVar10] | 1 << ((byte)uVar11 & 0x1f);
            if ((pMVar9->pData[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) == 0) {
              uVar3 = pMVar6->pData[uVar10] & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
            }
            pMVar6->pData[uVar10] = uVar3;
            pMVar6 = pMVar6->pNext;
            pMVar9 = pMVar9->pNext;
          } while (pMVar9 != (Mvc_Cube_t *)0x0);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nVarsRem);
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemap( Mvc_Cover_t * p, int * pVarsRem, int nVarsRem )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int i;
    // clone the cover
    pCover = Mvc_CoverAlloc( p->pMem, nVarsRem );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeAlloc( pCover );
        //Mvc_CubeBitClean( pCubeCopy );   //changed by wjiang
        Mvc_CubeBitFill( pCubeCopy );      //changed by wjiang
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    // copy the corresponding columns
    for ( i = 0; i < nVarsRem; i++ )
    {
        if (pVarsRem[i] < 0) 
            continue;     //added by wjiang
        assert( pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits );
        Mvc_CoverCopyColumn( p, pCover, pVarsRem[i], i );
    }
    return pCover;
}